

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)141,(moira::Mode)6,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  uint uVar3;
  uint value;
  StrWriter *this_00;
  Dn dn;
  byte bVar4;
  uint uVar5;
  Av<(moira::Instr)141,_(moira::Mode)6,_4> local_44 [5];
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  if (((uVar2 & 0xf000) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)141,(moira::Mode)6,4>(this,str,addr,op);
    return;
  }
  uVar3 = uVar2 >> 6;
  value = uVar3 & 0x1f;
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  Op<(moira::Mode)6,4>((Ea<(moira::Mode)6,_4> *)local_44,this,op & 7,addr);
  StrWriter::operator<<(str,(Ea<(moira::Mode)6,_4> *)local_44);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar5 = uVar2 & 0x820;
    StrWriter::operator<<(str,",");
    if (uVar5 == 0x820) {
      StrWriter::operator<<(str,(Dn)(uVar3 & 7));
    }
    else {
      if (uVar5 != 0x20) {
        if (uVar5 == 0x800) {
          StrWriter::operator<<(str,(Dn)(uVar3 & 7));
        }
        else {
          StrWriter::operator<<(str,value);
        }
        StrWriter::operator<<(str,",");
        StrWriter::operator<<(str,uVar2 & 0x1f);
        goto LAB_002dde0a;
      }
      StrWriter::operator<<(str,value);
    }
    StrWriter::operator<<(str,",");
    StrWriter::operator<<(str,(Dn)(uVar2 & 7));
    goto LAB_002dde0a;
  }
  bVar4 = 0x20;
  if ((uVar2 & 0x1f) != 0) {
    bVar4 = (byte)uVar2 & 0x1f;
  }
  uVar5 = uVar2 & 0x820;
  StrWriter::operator<<(str," {");
  if (uVar5 == 0x820) {
    StrWriter::operator<<(str,(Dn)(uVar3 & 7));
LAB_002ddd89:
    StrWriter::operator<<(str,":");
    dn.raw._1_3_ = 0;
    dn.raw._0_1_ = bVar4 & 7;
    StrWriter::operator<<(str,dn);
  }
  else {
    if (uVar5 == 0x20) {
      StrWriter::operator<<(str,value);
      goto LAB_002ddd89;
    }
    if (uVar5 == 0x800) {
      StrWriter::operator<<(str,(Dn)(uVar3 & 7));
    }
    else {
      StrWriter::operator<<(str,value);
    }
    StrWriter::operator<<(str,":");
    StrWriter::operator<<(str,(uint)bVar4);
  }
  StrWriter::operator<<(str,"}");
LAB_002dde0a:
  local_44[0].ext1 = 0;
  StrWriter::operator<<(str,local_44);
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}